

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

string * Corrade::Utility::String::ltrim
                   (string *__return_storage_ptr__,string *string,string *characters)

{
  char *data;
  size_t size;
  size_t in_R8;
  ArrayView<const_char> characters_00;
  ArrayView<const_char> local_50;
  string local_40 [32];
  string *local_20;
  string *characters_local;
  string *string_local;
  
  local_20 = characters;
  characters_local = string;
  string_local = __return_storage_ptr__;
  std::__cxx11::string::string(local_40,(string *)string);
  data = (char *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  Containers::ArrayView<const_char>::ArrayView(&local_50,data,size);
  characters_00._size = in_R8;
  characters_00._data = (char *)local_50._size;
  Implementation::ltrim
            (__return_storage_ptr__,(Implementation *)local_40,(string *)local_50._data,
             characters_00);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ltrim(std::string string, const std::string& characters) {
    return Implementation::ltrim(std::move(string), {characters.data(), characters.size()});
}